

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

void __thiscall QCollator::QCollator(QCollator *this)

{
  QLocalePrivate *pQVar1;
  EVP_PKEY_CTX *ctx;
  QLocale *in_RDI;
  long in_FS_OFFSET;
  QLocale *in_stack_ffffffffffffffa8;
  QCollatorPrivate *in_stack_ffffffffffffffb0;
  QLocale *this_00;
  QLocale *this_01;
  EVP_PKEY_CTX local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RDI;
  pQVar1 = (QLocalePrivate *)operator_new(0x20);
  QLocale::QLocale(this_00);
  QLocale::collation(this_01);
  ctx = local_10;
  QCollatorPrivate::QCollatorPrivate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  QLocale::~QLocale((QLocale *)0x4c1beb);
  QLocale::~QLocale((QLocale *)0x4c1bf5);
  (in_RDI->d).d.ptr = pQVar1;
  QCollatorPrivate::init((QCollatorPrivate *)(this_00->d).d.ptr,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCollator::QCollator()
    : d(new QCollatorPrivate(QLocale().collation()))
{
    d->init();
}